

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

int lua_cjson_new(lua_State *l)

{
  undefined1 local_c8 [8];
  luaL_Reg reg [11];
  lua_State *l_local;
  
  memcpy(local_c8,&DAT_001b48c0,0xb0);
  fpconv_init();
  lua_createtable(l,0,0);
  json_create_config(l);
  luaL_setfuncs(l,(luaL_Reg *)local_c8,1);
  lua_pushlightuserdata(l,(void *)0x0);
  lua_setfield(l,-2,"null");
  lua_pushstring(l,"cjson");
  lua_setfield(l,-2,"NAME");
  lua_pushstring(l,"2.1devel");
  lua_setfield(l,-2,"VERSION");
  return 1;
}

Assistant:

static int lua_cjson_new(lua_State *l)
{
    luaL_Reg reg[] = {
        { "decode", json_decode },
        { "decode_invalid_numbers", json_cfg_decode_invalid_numbers },
        { "decode_max_depth", json_cfg_decode_max_depth },
        { "encode", json_encode },
        { "encode_invalid_numbers", json_cfg_encode_invalid_numbers },
        { "encode_keep_buffer", json_cfg_encode_keep_buffer },
        { "encode_max_depth", json_cfg_encode_max_depth },
        { "encode_number_precision", json_cfg_encode_number_precision },
        { "encode_sparse_array", json_cfg_encode_sparse_array },
        { "new", lua_cjson_new },
        { NULL, NULL }
    };

    /* Initialise number conversions */
    fpconv_init();

    /* cjson module table */
    lua_newtable(l);

    /* Register functions with config data as upvalue */
    json_create_config(l);
    luaL_setfuncs(l, reg, 1);

    /* Set cjson.null */
    lua_pushlightuserdata(l, NULL);
    lua_setfield(l, -2, "null");

    /* Set module name / version fields */
    lua_pushliteral(l, CJSON_MODNAME);
    lua_setfield(l, -2, "NAME");
    lua_pushliteral(l, CJSON_VERSION);
    lua_setfield(l, -2, "VERSION");

    return 1;
}